

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool DerBase::DecodeSetOrSequenceOf<UTF8String>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<UTF8String,_std::allocator<UTF8String>_> *out)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  overflow_error *this;
  bool bVar6;
  undefined1 local_80 [8];
  UTF8String t;
  size_t cbElement;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  std::vector<UTF8String,_std::allocator<UTF8String>_>::clear(out);
  bVar2 = DecodeSequenceOrSet(type,pIn,cbIn,cbPrefix,cbSize,local_31);
  if (bVar2) {
    sVar4 = 2;
    if (local_31[0] == false) {
      sVar4 = *cbPrefix;
      uVar5 = *cbSize + sVar4;
      do {
        t.value.field_2._8_8_ = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_80 = (undefined1  [8])&PTR_EncodedSize_00151c68;
        t.super_DerBase.cbData = (size_t)&t.value._M_string_length;
        t.value._M_dataplus._M_p = (pointer)0x0;
        t.value._M_string_length._0_1_ = 0;
        if (uVar5 < sVar4) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar3 = Decode<std::__cxx11::string>
                          ((DerBase *)local_80,pIn + sVar4,uVar5 - sVar4,UTF8String,
                           (size_t *)(t.value.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &t.super_DerBase.cbData);
        uVar1 = t.value.field_2._8_8_;
        if (bVar3) {
          std::vector<UTF8String,_std::allocator<UTF8String>_>::push_back
                    (out,(value_type *)local_80);
          sVar4 = sVar4 + uVar1;
          bVar6 = sVar4 == *cbPrefix + *cbSize;
          bVar3 = !bVar6;
          bVar2 = (bool)(bVar6 | bVar2);
        }
        else {
          bVar2 = false;
          if (t.value.field_2._8_8_ == 0) {
            *cbPrefix = 0;
            *cbSize = 0;
          }
          bVar3 = false;
        }
        if ((size_type *)t.super_DerBase.cbData != &t.value._M_string_length) {
          operator_delete((void *)t.super_DerBase.cbData);
        }
      } while (bVar3);
      return bVar2;
    }
  }
  else {
    sVar4 = 0;
  }
  *cbPrefix = sVar4;
  *cbSize = 0;
  return bVar2;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}